

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioCreate(FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor)

{
  FAudio *pFVar1;
  float *pfVar2;
  
  FAudioCOMConstructEXT(ppFAudio,'\b');
  pFVar1 = *ppFAudio;
  pFVar1->initFlags = Flags;
  pfVar2 = (float *)(*pFVar1->pMalloc)(4);
  pFVar1->decodeCache = pfVar2;
  pfVar2 = (float *)(*pFVar1->pMalloc)(4);
  pFVar1->resampleCache = pfVar2;
  pFVar1->decodeSamples = 1;
  pFVar1->resampleSamples = 1;
  pFVar1->active = '\x01';
  return 0;
}

Assistant:

uint32_t FAudioCreate(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor
) {
	FAudioCOMConstructEXT(ppFAudio, FAUDIO_TARGET_VERSION);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}